

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O0

void BoundaryPM(Node *(*lists) [2],Node *leaves,int numsymbols,NodePool *pool,int index)

{
  Node *node;
  long lVar1;
  ulong weight;
  undefined8 *in_RCX;
  int in_EDX;
  Node *(*in_RSI) [2];
  long in_RDI;
  int in_R8D;
  size_t sum;
  int lastcount;
  Node *oldchain;
  Node *newchain;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd8;
  int numsymbols_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar2 = *(int *)(*(long *)(in_RDI + (long)in_R8D * 0x10 + 8) + 0x10);
  if ((in_R8D != 0) || (iVar2 < in_EDX)) {
    node = (Node *)*in_RCX;
    *in_RCX = node + 1;
    lVar1 = *(long *)(in_RDI + (long)in_R8D * 0x10 + 8);
    *(long *)(in_RDI + (long)in_R8D * 0x10) = lVar1;
    *(Node **)(in_RDI + (long)in_R8D * 0x10 + 8) = node;
    if (in_R8D == 0) {
      InitNode(*(size_t *)((long)in_RSI + (long)iVar2 * 0x18),iVar2 + 1,(Node *)0x0,node);
    }
    else {
      weight = **(long **)(in_RDI + (long)(in_R8D + -1) * 0x10) +
               **(long **)(in_RDI + (long)(in_R8D + -1) * 0x10 + 8);
      if ((iVar2 < in_EDX) && (*(ulong *)((long)in_RSI + (long)iVar2 * 0x18) < weight)) {
        InitNode(*(size_t *)((long)in_RSI + (long)iVar2 * 0x18),iVar2 + 1,*(Node **)(lVar1 + 8),node
                );
      }
      else {
        InitNode(weight,iVar2,*(Node **)(in_RDI + (long)(in_R8D + -1) * 0x10 + 8),node);
        numsymbols_00 = (int)((ulong)in_RCX >> 0x20);
        iVar2 = (int)((ulong)node >> 0x20);
        BoundaryPM(in_RSI,(Node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),numsymbols_00,
                   (NodePool *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),iVar2);
        BoundaryPM(in_RSI,(Node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),numsymbols_00,
                   (NodePool *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),iVar2);
      }
    }
  }
  return;
}

Assistant:

static void BoundaryPM(Node* (*lists)[2], Node* leaves, int numsymbols,
                       NodePool* pool, int index) {
  Node* newchain;
  Node* oldchain;
  int lastcount = lists[index][1]->count;  /* Count of last chain of list. */

  if (index == 0 && lastcount >= numsymbols) return;

  newchain = pool->next++;
  oldchain = lists[index][1];

  /* These are set up before the recursive calls below, so that there is a list
  pointing to the new node, to let the garbage collection know it's in use. */
  lists[index][0] = oldchain;
  lists[index][1] = newchain;

  if (index == 0) {
    /* New leaf node in list 0. */
    InitNode(leaves[lastcount].weight, lastcount + 1, 0, newchain);
  } else {
    size_t sum = lists[index - 1][0]->weight + lists[index - 1][1]->weight;
    if (lastcount < numsymbols && sum > leaves[lastcount].weight) {
      /* New leaf inserted in list, so count is incremented. */
      InitNode(leaves[lastcount].weight, lastcount + 1, oldchain->tail,
          newchain);
    } else {
      InitNode(sum, lastcount, lists[index - 1][1], newchain);
      /* Two lookahead chains of previous list used up, create new ones. */
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
    }
  }
}